

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void lowbd_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte in_CL;
  __m128i *bufu;
  __m128i *bufl;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2_conflict1 row_txfm;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf2 [8];
  __m128i buf1 [16];
  __m128i buf0 [16];
  int in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  int16_t *in_stack_fffffffffffffc58;
  __m256i *in;
  __m128i *local_3a0;
  int local_398;
  int local_394;
  transform_1d_avx2_conflict1 local_390;
  transform_1d_sse2 local_388;
  int size;
  longlong local_360 [3];
  __m128i *in_stack_fffffffffffffcb8;
  __m128i *in_stack_fffffffffffffcc0;
  longlong local_250 [16];
  longlong alStack_1d0 [16];
  longlong local_150 [16];
  longlong alStack_d0 [17];
  byte local_45;
  
  piVar1 = av1_fwd_txfm_shift_ls[7];
  local_45 = in_CL;
  iVar2 = get_txw_idx('\a');
  iVar3 = get_txh_idx('\a');
  iVar4 = (int)av1_fwd_cos_bit_col[iVar2][iVar3];
  iVar2 = (int)av1_fwd_cos_bit_row[iVar2][iVar3];
  size = 8;
  iVar3 = 0x10;
  local_388 = col_txfm8x16_arr[local_45];
  local_390 = row_txfm8x16_arr[local_45];
  get_flip_cfg(local_45,&local_394,&local_398);
  if (local_394 == 0) {
    load_buffer_16bit_to_16bit
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
               (__m128i *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
               in_stack_fffffffffffffc44);
  }
  else {
    load_buffer_16bit_to_16bit_flip
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
               (__m128i *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
               in_stack_fffffffffffffc44);
  }
  round_shift_16bit((__m128i *)local_150,0x10,(int)*piVar1);
  (*local_388)((__m128i *)local_150,(__m128i *)local_150,(int8_t)iVar4);
  round_shift_16bit((__m128i *)local_150,0x10,(int)piVar1[1]);
  transpose_16bit_8x8(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  transpose_16bit_8x8(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  if (local_398 == 0) {
    local_3a0 = (__m128i *)local_250;
    in = (__m256i *)alStack_1d0;
  }
  else {
    local_3a0 = (__m128i *)local_150;
    in = (__m256i *)alStack_d0;
    flip_buf_sse2((__m128i *)local_250,local_3a0,8);
    flip_buf_sse2((__m128i *)alStack_1d0,(__m128i *)in,8);
  }
  pack_reg(local_3a0,(__m128i *)in,(__m256i *)local_360);
  (*local_390)((__m256i *)local_360,(__m256i *)local_360,(int8_t)iVar2);
  round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar4,iVar2),size,iVar3);
  store_rect_buffer_16bit_to_32bit_w16_avx2
            (in,(int32_t *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);

  __m128i *bufl, *bufu;
  if (lr_flip) {
    bufl = buf0;
    bufu = buf0 + 8;
    flip_buf_sse2(buf1 + width * 0, bufl, width);
    flip_buf_sse2(buf1 + width * 1, bufu, width);
  } else {
    bufl = buf1 + width * 0;
    bufu = buf1 + width * 1;
  }
  pack_reg(bufl, bufu, buf2);
  row_txfm(buf2, buf2, cos_bit_row);
  round_shift_16bit_w16_avx2(buf2, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf2, output, height, width);
}